

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyedgecurve.cpp
# Opt level: O2

bool __thiscall ON_PolyEdgeSegment::IsClosed(ON_PolyEdgeSegment *this)

{
  ON_BrepEdge *this_00;
  undefined1 uVar1;
  bool bVar2;
  int iVar3;
  ON_Curve *pOVar4;
  ON_Curve *pOVar5;
  double dVar6;
  ON_Interval local_58;
  ON_Interval local_48;
  ON_Interval local_38;
  ON_Interval local_28;
  
  uVar1 = ON_CurveProxy::IsClosed(&this->super_ON_CurveProxy);
  if (((!(bool)uVar1) && (this_00 = this->m_edge, this_00 != (ON_BrepEdge *)0x0)) &&
     (this_00->m_vi[0] == this_00->m_vi[1])) {
    pOVar4 = ON_CurveProxy::ProxyCurve(&this_00->super_ON_CurveProxy);
    pOVar5 = ON_CurveProxy::ProxyCurve(&this->super_ON_CurveProxy);
    if (pOVar4 == pOVar5) {
      local_28 = ON_CurveProxy::ProxyCurveDomain(&this->m_edge->super_ON_CurveProxy);
      local_38 = ON_CurveProxy::ProxyCurveDomain(&this->super_ON_CurveProxy);
      dVar6 = local_38.m_t[1];
      bVar2 = ON_Interval::operator==(&local_28,&local_38);
      if (bVar2) {
        pOVar4 = ON_CurveProxy::ProxyCurve(&this->super_ON_CurveProxy);
        if (pOVar4 != (ON_Curve *)0x0) {
          pOVar4 = ON_CurveProxy::ProxyCurve(&this->super_ON_CurveProxy);
          (*(pOVar4->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(pOVar4);
          local_48.m_t[1] = dVar6;
          local_58 = ON_CurveProxy::ProxyCurveDomain(&this->super_ON_CurveProxy);
          bVar2 = ON_Interval::operator==(&local_48,&local_58);
          if (bVar2) {
            iVar3 = (*(this->m_edge->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.
                      super_ON_Object._vptr_ON_Object[0x34])();
            uVar1 = (undefined1)iVar3;
          }
          else {
            uVar1 = 0;
          }
        }
      }
    }
  }
  return (bool)uVar1;
}

Assistant:

bool ON_PolyEdgeSegment::IsClosed(void) const
{
  bool rc = ON_CurveProxy::IsClosed();
  if ( !rc
       && m_edge
       && m_edge->m_vi[0] == m_edge->m_vi[1]
       && m_edge->ProxyCurve() == ProxyCurve()
       && m_edge->ProxyCurveDomain() == ProxyCurveDomain()
       && 0 != ProxyCurve()
       && ProxyCurve()->Domain() == ProxyCurveDomain()
       )
  {
    rc = m_edge->IsClosed();
  }
  return rc;
}